

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::PHP_IP(CPU *this)

{
  this->cycles = 3;
  WriteByteToStack(this,(this->field_6).ps);
  return;
}

Assistant:

void CPU::PHP_IP()
{
    cycles = 3;
    WriteByteToStack(ps);
}